

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uchar *buf;
  uchar *iv;
  long lVar4;
  void *pvVar5;
  ulong __n;
  ulong uVar6;
  
  buf = (uchar *)EVP_CIPHER_CTX_buf_noconst();
  iv = (uchar *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar2 = EVP_CIPHER_CTX_get_num(ctx);
  if (iVar2 == 0) {
    uVar6 = 0;
  }
  else {
    iVar2 = EVP_CIPHER_CTX_get_num(ctx);
    lVar4 = (long)iVar2;
    for (uVar6 = 0; (lVar4 + uVar6 < 8 && (uVar6 < inl)); uVar6 = uVar6 + 1) {
      iVar3 = EVP_CIPHER_CTX_is_encrypting(ctx);
      bVar1 = in[uVar6];
      if (iVar3 == 0) {
        buf[uVar6 + lVar4 + 8] = bVar1;
      }
      out[uVar6] = bVar1 ^ buf[uVar6 + lVar4];
      iVar3 = EVP_CIPHER_CTX_is_encrypting(ctx);
      if (iVar3 != 0) {
        buf[uVar6 + lVar4 + 8] = out[uVar6];
      }
    }
    if (lVar4 + uVar6 != 8) {
      iVar2 = iVar2 + (int)uVar6;
      goto LAB_00112134;
    }
    out = out + uVar6;
    in = in + uVar6;
    *(undefined8 *)iv = *(undefined8 *)(buf + 8);
    EVP_CIPHER_CTX_set_num(ctx,0);
  }
  for (; 7 < inl - uVar6; uVar6 = uVar6 + 8) {
    pvVar5 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_crypt_mesh(pvVar5,iv,buf);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 == 0) {
      *(undefined8 *)iv = *(undefined8 *)in;
    }
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      out[lVar4] = in[lVar4] ^ buf[lVar4];
    }
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 != 0) {
      *(undefined8 *)iv = *(undefined8 *)out;
    }
    in = in + 8;
    out = out + 8;
  }
  if (uVar6 < inl) {
    pvVar5 = (void *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    gost_crypt_mesh(pvVar5,iv,buf);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 == 0) {
      memcpy(buf + 8,in,inl - uVar6);
    }
    for (__n = 0; uVar6 + __n < inl; __n = __n + 1) {
      out[__n] = in[__n] ^ buf[__n];
    }
    EVP_CIPHER_CTX_set_num(ctx,__n & 0xffffffff);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 == 0) {
      return 1;
    }
    memcpy(buf + 8,out,__n);
    return 1;
  }
  iVar2 = 0;
LAB_00112134:
  EVP_CIPHER_CTX_set_num(ctx,iVar2);
  return 1;
}

Assistant:

static int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                       const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t i = 0;
    size_t j = 0;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
/* process partial block if any */
    if (EVP_CIPHER_CTX_num(ctx)) {
        for (j = EVP_CIPHER_CTX_num(ctx), i = 0; j < 8 && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            if (!EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *in_ptr;
            *out_ptr = buf[j] ^ (*in_ptr);
            if (EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *out_ptr;
        }
        if (j == 8) {
            memcpy(iv, buf + 8, 8);
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, j);
            return 1;
        }
    }

    for (; (inl - i) >= 8; i += 8, in_ptr += 8, out_ptr += 8) {
        /*
         * block cipher current iv
         */
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, in_ptr, 8);
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        /* Encrypt */
        /* Next iv is next block of cipher text */
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, out_ptr, 8);
    }
/* Process rest of buffer */
    if (i < inl) {
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, in_ptr, inl - i);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, j);
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, out_ptr, j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }
    return 1;
}